

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

QMatchData * __thiscall
QUnsortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QUnsortedModelEngine *this,QString *part,
          QModelIndex *parent,int n)

{
  QString part_00;
  Data *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  long *plVar7;
  int *piVar8;
  int iVar9;
  long in_FS_OFFSET;
  QMatchData hint;
  undefined1 in_stack_ffffffffffffff18 [12];
  QArrayData *pQVar10;
  QIndexMapper local_c0;
  QMatchData local_98;
  QMatchData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.indices._0_8_ = 0xaaaaaaaaaaaaaa00;
  local_68.indices.vector.d.d = (Data *)0x0;
  local_68.indices.vector.d.ptr._0_4_ = 0;
  local_68.indices.vector.d.ptr._4_4_ = 0;
  local_68.indices.vector.d.size._0_4_ = 0;
  local_68.indices.vector.d.size._4_4_ = 0;
  local_68.indices.f = 0;
  local_68.indices.t = -1;
  local_68.exactMatchIndex = -1;
  local_68.partial = false;
  local_68._45_3_ = 0xaaaaaa;
  local_98.indices.v = true;
  local_98.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr = (int *)0x0;
  local_98.indices.vector.d.size = 0;
  local_98.indices.f = -1;
  local_98.indices.t = -1;
  local_98.exactMatchIndex = -1;
  local_98.partial = true;
  local_98._45_3_ = 0xaaaaaa;
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  bVar4 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&local_98);
  if (bVar4) {
    bVar5 = local_98.partial;
LAB_0064a88d:
    if ((bVar5 & 1) != 0) {
      if ((n != -1) || (local_98.exactMatchIndex != -1)) {
        if (local_98.indices.v == true) {
          iVar6 = (int)local_98.indices.vector.d.size;
        }
        else {
          iVar6 = (local_98.indices.t - local_98.indices.f) + 1;
        }
        if (n <= iVar6) goto LAB_0064aa48;
      }
      iVar6 = (**(code **)(*plVar7 + 0x78))(plVar7,parent);
      piVar8 = (int *)(CONCAT44(local_68.indices.vector.d.ptr._4_4_,
                                local_68.indices.vector.d.ptr._0_4_) + -4 +
                      CONCAT44(local_68.indices.vector.d.size._4_4_,
                               (undefined4)local_68.indices.vector.d.size) * 4);
      if (local_68.indices.v == false) {
        piVar8 = &local_68.indices.t;
      }
      local_c0.f = *piVar8 + 1;
      local_c0.v = false;
      local_c0._1_7_ = 0xaaaaaaaaaaaaaa;
      local_c0.vector.d.d = (Data *)0x0;
      local_c0.vector.d.ptr._0_4_ = 0;
      local_c0.vector.d.ptr._4_4_ = 0;
      local_c0.vector.d.size._0_4_ = 0;
      local_c0.vector.d.size._4_4_ = 0;
      if (n == -1) {
        iVar9 = -1;
      }
      else {
        if (local_98.indices.v == true) {
          iVar9 = (int)local_98.indices.vector.d.size;
        }
        else {
          iVar9 = (local_98.indices.t - local_98.indices.f) + 1;
        }
        iVar9 = n - iVar9;
      }
      local_c0.t = iVar6 + -1;
      iVar9 = buildIndices(this,part,parent,iVar9,&local_c0,&local_98);
      local_98.partial = iVar6 + -1 != iVar9;
    }
  }
  else {
    bVar4 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&local_68);
    if (bVar4) {
      if ((local_68.indices._0_8_ & 1) == 0) {
        if (local_68.indices.f <= local_68.indices.t) goto LAB_0064a917;
      }
      else if (CONCAT44(local_68.indices.vector.d.size._4_4_,
                        (undefined4)local_68.indices.vector.d.size) != 0) goto LAB_0064a850;
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
      *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
      __return_storage_ptr__->partial = false;
      if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
            ._M_i == 0) {
          QArrayData::deallocate(&(local_98.indices.vector.d.d)->super_QArrayData,4,0x10);
        }
      }
      goto LAB_0064aae3;
    }
    if ((local_68.indices._0_8_ & 1) == 0) {
LAB_0064a917:
      if (local_68.indices.f <= local_68.indices.t) goto LAB_0064a85f;
    }
    else {
LAB_0064a850:
      if (CONCAT44(local_68.indices.vector.d.size._4_4_,(undefined4)local_68.indices.vector.d.size)
          != 0) {
LAB_0064a85f:
        buildIndices(this,part,parent,0x7fffffff,&local_68.indices,&local_98);
        local_98.partial = local_68.partial;
        bVar5 = local_68.partial;
        goto LAB_0064a88d;
      }
    }
    iVar6 = (**(code **)(*plVar7 + 0x78))(plVar7,parent);
    local_c0.v = false;
    local_c0._1_7_ = 0xaaaaaaaaaaaaaa;
    local_c0.vector.d.d = (Data *)0x0;
    local_c0.vector.d.ptr._0_4_ = 0;
    local_c0.vector.d.ptr._4_4_ = 0;
    local_c0.vector.d.size._0_4_ = 0;
    local_c0.vector.d.size._4_4_ = 0;
    local_c0.f = 0;
    local_c0.t = iVar6 + -1;
    iVar9 = buildIndices(this,part,parent,n,&local_c0,&local_98);
    local_98.partial = iVar9 != iVar6 + -1;
  }
LAB_0064aa48:
  pQVar10 = &((part->d).d)->super_QArrayData;
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  part_00.d.ptr._4_4_ = n;
  part_00.d._0_12_ = in_stack_ffffffffffffff18;
  part_00.d.size = (qsizetype)pQVar10;
  QCompletionEngine::saveInCache
            (&this->super_QCompletionEngine,part_00,(QModelIndex *)&stack0xffffffffffffff28,
             (QMatchData *)parent);
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  piVar8 = local_98.indices.vector.d.ptr;
  pDVar1 = local_98.indices.vector.d.d;
  (__return_storage_ptr__->indices).v = local_98.indices.v;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr = (int *)0x0;
  (__return_storage_ptr__->indices).vector.d.d = pDVar1;
  (__return_storage_ptr__->indices).vector.d.ptr = piVar8;
  uVar2 = (int)local_98.indices.vector.d.size;
  uVar3 = local_98.indices.vector.d.size._4_4_;
  local_98.indices.vector.d.size = 0;
  *(undefined4 *)&(__return_storage_ptr__->indices).vector.d.size = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = uVar3;
  (__return_storage_ptr__->indices).f = local_98.indices.f;
  (__return_storage_ptr__->indices).t = local_98.indices.t;
  __return_storage_ptr__->exactMatchIndex = local_98.exactMatchIndex;
  __return_storage_ptr__->partial = local_98.partial;
LAB_0064aae3:
  if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QMatchData QUnsortedModelEngine::filter(const QString& part, const QModelIndex& parent, int n)
{
    QMatchData hint;

    QList<int> v;
    QIndexMapper im(v);
    QMatchData m(im, -1, true);

    const QAbstractItemModel *model = c->proxy->sourceModel();
    bool foundInCache = lookupCache(part, parent, &m);

    if (!foundInCache) {
        if (matchHint(part, parent, &hint) && !hint.isValid())
            return QMatchData();
    }

    if (!foundInCache && !hint.isValid()) {
        const int lastRow = model->rowCount(parent) - 1;
        QIndexMapper all(0, lastRow);
        int lastIndex = buildIndices(part, parent, n, all, &m);
        m.partial = (lastIndex != lastRow);
    } else {
        if (!foundInCache) { // build from hint as much as we can
            buildIndices(part, parent, INT_MAX, hint.indices, &m);
            m.partial = hint.partial;
        }
        if (m.partial && ((n == -1 && m.exactMatchIndex == -1) || (m.indices.count() < n))) {
            // need more and have more
            const int lastRow = model->rowCount(parent) - 1;
            QIndexMapper rest(hint.indices.last() + 1, lastRow);
            int want = n == -1 ? -1 : n - m.indices.count();
            int lastIndex = buildIndices(part, parent, want, rest, &m);
            m.partial = (lastRow != lastIndex);
        }
    }

    saveInCache(part, parent, m);
    return m;
}